

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

CPubKey * HexToPubKey(CPubKey *__return_storage_ptr__,string *hex_in)

{
  size_type sVar1;
  bool bVar2;
  UniValue *pUVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  long in_FS_OFFSET;
  string_view hex_str;
  string_view str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  str._M_str = (hex_in->_M_dataplus)._M_p;
  str._M_len = hex_in->_M_string_length;
  bVar2 = IsHex(str);
  if (bVar2) {
    sVar1 = hex_in->_M_string_length;
    if ((sVar1 == 0x42) || (sVar1 == 0x82)) {
      hex_str._M_str = (hex_in->_M_dataplus)._M_p;
      hex_str._M_len = sVar1;
      ParseHex<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,hex_str);
      CPubKey::Set<unsigned_char_const*>
                (__return_storage_ptr__,(uchar *)local_48._M_dataplus._M_p,
                 (uchar *)local_48._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_48._M_dataplus._M_p,
                        local_48.field_2._M_allocated_capacity - (long)local_48._M_dataplus._M_p);
      }
      bVar2 = CPubKey::IsFullyValid(__return_storage_ptr__);
      if (bVar2) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          return __return_storage_ptr__;
        }
      }
      else {
        pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
        std::operator+(&bStack_68,"Pubkey \"",hex_in);
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&bStack_68,"\" must be cryptographically valid.");
        local_48._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
        paVar5 = &pbVar4->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p == paVar5) {
          local_48.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
          local_48.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        }
        else {
          local_48.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        }
        local_48._M_string_length = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
        pbVar4->_M_string_length = 0;
        (pbVar4->field_2)._M_local_buf[0] = '\0';
        JSONRPCError(pUVar3,-5,&local_48);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
        }
      }
    }
    else {
      pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
      std::operator+(&bStack_68,"Pubkey \"",hex_in);
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&bStack_68,"\" must have a length of either 33 or 65 bytes");
      local_48._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
      paVar5 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p == paVar5) {
        local_48.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_48.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      }
      else {
        local_48.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      }
      local_48._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      JSONRPCError(pUVar3,-5,&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
  }
  else {
    pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
    std::operator+(&bStack_68,"Pubkey \"",hex_in);
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&bStack_68,"\" must be a hex string");
    local_48._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == paVar5) {
      local_48.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_48.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    }
    else {
      local_48.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_48._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    JSONRPCError(pUVar3,-5,&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  __stack_chk_fail();
}

Assistant:

CPubKey HexToPubKey(const std::string& hex_in)
{
    if (!IsHex(hex_in)) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Pubkey \"" + hex_in + "\" must be a hex string");
    }
    if (hex_in.length() != 66 && hex_in.length() != 130) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Pubkey \"" + hex_in + "\" must have a length of either 33 or 65 bytes");
    }
    CPubKey vchPubKey(ParseHex(hex_in));
    if (!vchPubKey.IsFullyValid()) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Pubkey \"" + hex_in + "\" must be cryptographically valid.");
    }
    return vchPubKey;
}